

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

stb_vorbis * stb_vorbis_open_memory(uchar *data,int len,int *error,stb_vorbis_alloc *alloc)

{
  int iVar1;
  stb_vorbis *f;
  vorb local_790;
  
  if (data == (uchar *)0x0) {
    return (stb_vorbis *)0x0;
  }
  memset(&local_790,0,0x770);
  if (alloc != (stb_vorbis_alloc *)0x0) {
    local_790.alloc.alloc_buffer = alloc->alloc_buffer;
    local_790.alloc.alloc_buffer_length_in_bytes =
         (int)*(ulong *)&alloc->alloc_buffer_length_in_bytes;
    local_790.temp_offset = local_790.alloc.alloc_buffer_length_in_bytes & 0xfffffff8;
    local_790.alloc._8_8_ = *(ulong *)&alloc->alloc_buffer_length_in_bytes & 0xfffffffffffffff8;
  }
  local_790.eof = 0;
  local_790.error = VORBIS__no_error;
  local_790.codebooks = (Codebook *)0x0;
  local_790.page_crc_tests = -1;
  local_790.close_on_free = 0;
  local_790.f = (FILE *)0x0;
  local_790.stream_end = data + len;
  local_790.push_mode = '\0';
  local_790.stream = data;
  local_790.stream_start = data;
  local_790.stream_len = len;
  iVar1 = start_decoder(&local_790);
  if (iVar1 != 0) {
    local_790.setup_memory_required = local_790.setup_memory_required + 0x770;
    if (local_790.alloc.alloc_buffer == (char *)0x0) {
      f = (stb_vorbis *)malloc(0x770);
    }
    else {
      if (local_790.temp_offset < local_790.setup_offset + 0x770) goto LAB_001416f4;
      f = (stb_vorbis *)(local_790.alloc.alloc_buffer + local_790.setup_offset);
      local_790.setup_offset = local_790.setup_offset + 0x770;
    }
    if (f != (stb_vorbis *)0x0) {
      memcpy(f,&local_790,0x770);
      vorbis_pump_first_frame(f);
      if (error != (int *)0x0) {
        *error = 0;
        return f;
      }
      return f;
    }
  }
LAB_001416f4:
  if (error != (int *)0x0) {
    *error = local_790.error;
  }
  vorbis_deinit(&local_790);
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_memory(const unsigned char *data, int len, int *error, const stb_vorbis_alloc *alloc)
{
   stb_vorbis *f, p;
   if (data == NULL) return NULL;
   vorbis_init(&p, alloc);
   p.stream = (uint8 *) data;
   p.stream_end = (uint8 *) data + len;
   p.stream_start = (uint8 *) p.stream;
   p.stream_len = len;
   p.push_mode = FALSE;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         if (error) *error = VORBIS__no_error;
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}